

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::FboStateQueryTests::init(FboStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  FboStateQueryTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x98);
  anon_unknown_1::AttachmentObjectCase::AttachmentObjectCase
            ((AttachmentObjectCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "framebuffer_attachment_object",
             "FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE and FRAMEBUFFER_ATTACHMENT_OBJECT_NAME");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  anon_unknown_1::AttachmentTextureLevelCase::AttachmentTextureLevelCase
            ((AttachmentTextureLevelCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "framebuffer_attachment_texture_level","FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  anon_unknown_1::AttachmentTextureCubeMapFaceCase::AttachmentTextureCubeMapFaceCase
            ((AttachmentTextureCubeMapFaceCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "framebuffer_attachment_texture_cube_map_face",
             "FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void FboStateQueryTests::init (void)
{
	addChild(new AttachmentObjectCase				(m_context, "framebuffer_attachment_object",				"FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE and FRAMEBUFFER_ATTACHMENT_OBJECT_NAME"));
	addChild(new AttachmentTextureLevelCase			(m_context, "framebuffer_attachment_texture_level",			"FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL"));
	addChild(new AttachmentTextureCubeMapFaceCase	(m_context, "framebuffer_attachment_texture_cube_map_face",	"FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE"));
}